

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_utils.cpp
# Opt level: O0

vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *
SetupDummyInputs(FillableSigningProvider *keystoreRet,CCoinsViewCache *coinsRet,
                array<long,_4UL> *nValues)

{
  value_type_conflict6 vVar1;
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  const_reference pvVar2;
  reference pvVar3;
  long *in_RSI;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *in_RDI;
  long in_FS_OFFSET;
  int i;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *dummyTransactions;
  CKey key [4];
  CTransaction *in_stack_fffffffffffffb18;
  undefined7 in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb27;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_fffffffffffffb28;
  PKHash *in_stack_fffffffffffffb30;
  CScript *in_stack_fffffffffffffb38;
  CKey *in_stack_fffffffffffffb40;
  long *plVar4;
  undefined8 in_stack_fffffffffffffb48;
  opcodetype opcode;
  long *plVar5;
  CMutableTransaction *in_stack_fffffffffffffb50;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffb58;
  CTransaction *this;
  undefined8 in_stack_fffffffffffffb70;
  undefined1 *puVar6;
  CTransaction *in_stack_fffffffffffffb78;
  CTransaction *tx;
  CCoinsViewCache *in_stack_fffffffffffffb80;
  CCoinsViewCache *cache;
  long *local_400;
  int local_3e8;
  undefined1 local_288 [80];
  CTransaction local_238;
  CTransaction local_170 [2];
  long local_48 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffffb18);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::resize
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffffb38,(size_type)in_stack_fffffffffffffb30);
  local_400 = local_48;
  do {
    CKey::CKey((CKey *)in_stack_fffffffffffffb18);
    local_400 = local_400 + 2;
  } while (local_400 != &local_8);
  for (local_3e8 = 0; opcode = (opcodetype)((ulong)in_stack_fffffffffffffb48 >> 0x20), local_3e8 < 4
      ; local_3e8 = local_3e8 + 1) {
    CKey::MakeNewKey((CKey *)in_stack_fffffffffffffb28,(bool)in_stack_fffffffffffffb27);
    (**(code **)(*in_RSI + 0x58))(in_RSI,local_48 + (long)local_3e8 * 2);
  }
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::operator[]
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffffb28,CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20)
            );
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffb38,
             (size_type)in_stack_fffffffffffffb30);
  pvVar2 = std::array<long,_4UL>::operator[]
                     ((array<long,_4UL> *)in_stack_fffffffffffffb28,
                      CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  vVar1 = *pvVar2;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::operator[]
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffffb28,CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20)
            );
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffb28,
                      CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  pvVar3->nValue = vVar1;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::operator[]
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffffb28,CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20)
            );
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffb28,
             CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  CKey::GetPubKey(in_stack_fffffffffffffb40);
  ToByteVector<CPubKey>((CPubKey *)in_stack_fffffffffffffb58._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            (in_stack_fffffffffffffb28,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  b._M_extent._M_extent_value = in_stack_fffffffffffffb58._M_extent_value;
  b._M_ptr = (pointer)in_stack_fffffffffffffb50;
  CScript::operator<<(in_stack_fffffffffffffb38,b);
  CScript::operator<<((CScript *)in_stack_fffffffffffffb50,opcode);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb28);
  pvVar2 = std::array<long,_4UL>::operator[]
                     ((array<long,_4UL> *)in_stack_fffffffffffffb28,
                      CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  vVar1 = *pvVar2;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::operator[]
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffffb28,CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20)
            );
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffb28,
                      CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  pvVar3->nValue = vVar1;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::operator[]
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffffb28,CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20)
            );
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffb28,
             CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  CKey::GetPubKey(in_stack_fffffffffffffb40);
  ToByteVector<CPubKey>((CPubKey *)in_stack_fffffffffffffb58._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            (in_stack_fffffffffffffb28,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  b_00._M_extent._M_extent_value = in_stack_fffffffffffffb58._M_extent_value;
  b_00._M_ptr = (pointer)in_stack_fffffffffffffb50;
  CScript::operator<<(in_stack_fffffffffffffb38,b_00);
  CScript::operator<<((CScript *)in_stack_fffffffffffffb50,opcode);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb28);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::operator[]
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffffb28,CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20)
            );
  CTransaction::CTransaction
            ((CTransaction *)in_stack_fffffffffffffb58._M_extent_value,in_stack_fffffffffffffb50);
  AddCoins(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
           (int)((ulong)in_stack_fffffffffffffb70 >> 0x20),
           SUB81((ulong)in_stack_fffffffffffffb70 >> 0x18,0));
  CTransaction::~CTransaction(in_stack_fffffffffffffb18);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::operator[]
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffffb28,CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20)
            );
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffb38,
             (size_type)in_stack_fffffffffffffb30);
  pvVar2 = std::array<long,_4UL>::operator[]
                     ((array<long,_4UL> *)in_stack_fffffffffffffb28,
                      CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  vVar1 = *pvVar2;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::operator[]
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffffb28,CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20)
            );
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffb28,
                      CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  pvVar3->nValue = vVar1;
  CKey::GetPubKey(in_stack_fffffffffffffb40);
  PKHash::PKHash(in_stack_fffffffffffffb30,(CPubKey *)in_stack_fffffffffffffb28);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash,void,void,PKHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffffb28,
             (PKHash *)CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  GetScriptForDestination((CTxDestination *)in_stack_fffffffffffffb18);
  cache = (CCoinsViewCache *)0x1;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::operator[]
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffffb28,CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20)
            );
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffb28,
             CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  tx = local_170;
  CScript::operator=((CScript *)in_stack_fffffffffffffb28,
                     (CScript *)CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  CScript::~CScript((CScript *)in_stack_fffffffffffffb18);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffffb18);
  pvVar2 = std::array<long,_4UL>::operator[]
                     ((array<long,_4UL> *)in_stack_fffffffffffffb28,
                      CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  vVar1 = *pvVar2;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::operator[]
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffffb28,CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20)
            );
  pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffb28,
                      CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  pvVar3->nValue = vVar1;
  CKey::GetPubKey(in_stack_fffffffffffffb40);
  PKHash::PKHash(in_stack_fffffffffffffb30,(CPubKey *)in_stack_fffffffffffffb28);
  puVar6 = local_288;
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash,void,void,PKHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffffb28,
             (PKHash *)CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  GetScriptForDestination((CTxDestination *)in_stack_fffffffffffffb18);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::operator[]
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffffb28,CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20)
            );
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffb28,
             CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  this = &local_238;
  CScript::operator=((CScript *)in_stack_fffffffffffffb28,
                     (CScript *)CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  CScript::~CScript((CScript *)in_stack_fffffffffffffb18);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffffb18);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::operator[]
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffffb28,CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20)
            );
  CTransaction::CTransaction(this,in_stack_fffffffffffffb50);
  AddCoins(cache,tx,(int)((ulong)puVar6 >> 0x20),SUB81((ulong)puVar6 >> 0x18,0));
  CTransaction::~CTransaction(in_stack_fffffffffffffb18);
  plVar5 = local_48;
  plVar4 = &local_8;
  do {
    plVar4 = plVar4 + -2;
    CKey::~CKey((CKey *)in_stack_fffffffffffffb18);
  } while (plVar4 != plVar5);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::vector<CMutableTransaction> SetupDummyInputs(FillableSigningProvider& keystoreRet, CCoinsViewCache& coinsRet, const std::array<CAmount,4>& nValues)
{
    std::vector<CMutableTransaction> dummyTransactions;
    dummyTransactions.resize(2);

    // Add some keys to the keystore:
    CKey key[4];
    for (int i = 0; i < 4; i++) {
        key[i].MakeNewKey(i % 2);
        keystoreRet.AddKey(key[i]);
    }

    // Create some dummy input transactions
    dummyTransactions[0].vout.resize(2);
    dummyTransactions[0].vout[0].nValue = nValues[0];
    dummyTransactions[0].vout[0].scriptPubKey << ToByteVector(key[0].GetPubKey()) << OP_CHECKSIG;
    dummyTransactions[0].vout[1].nValue = nValues[1];
    dummyTransactions[0].vout[1].scriptPubKey << ToByteVector(key[1].GetPubKey()) << OP_CHECKSIG;
    AddCoins(coinsRet, CTransaction(dummyTransactions[0]), 0);

    dummyTransactions[1].vout.resize(2);
    dummyTransactions[1].vout[0].nValue = nValues[2];
    dummyTransactions[1].vout[0].scriptPubKey = GetScriptForDestination(PKHash(key[2].GetPubKey()));
    dummyTransactions[1].vout[1].nValue = nValues[3];
    dummyTransactions[1].vout[1].scriptPubKey = GetScriptForDestination(PKHash(key[3].GetPubKey()));
    AddCoins(coinsRet, CTransaction(dummyTransactions[1]), 0);

    return dummyTransactions;
}